

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadsusp.cpp
# Opt level: O0

PAL_ERROR CorUnix::InternalResumeThread
                    (CPalThread *pthrResumer,HANDLE hTargetThread,DWORD *pdwSuspendCount)

{
  IPalObject *local_38;
  IPalObject *pobjThread;
  CPalThread *pthrTarget;
  DWORD *pDStack_20;
  PAL_ERROR palError;
  DWORD *pdwSuspendCount_local;
  HANDLE hTargetThread_local;
  CPalThread *pthrResumer_local;
  
  pthrTarget._4_4_ = 0;
  pobjThread = (IPalObject *)0x0;
  local_38 = (IPalObject *)0x0;
  pDStack_20 = pdwSuspendCount;
  pdwSuspendCount_local = (DWORD *)hTargetThread;
  hTargetThread_local = pthrResumer;
  pthrTarget._4_4_ =
       InternalGetThreadDataFromHandle
                 (pthrResumer,hTargetThread,0,(CPalThread **)&pobjThread,&local_38);
  if (pthrTarget._4_4_ == 0) {
    pthrTarget._4_4_ =
         CThreadSuspensionInfo::InternalResumeThreadFromData
                   ((CThreadSuspensionInfo *)((long)hTargetThread_local + 0x488),
                    (CPalThread *)hTargetThread_local,(CPalThread *)pobjThread,pDStack_20);
  }
  if (local_38 != (IPalObject *)0x0) {
    (*local_38->_vptr_IPalObject[8])(local_38,hTargetThread_local);
  }
  return pthrTarget._4_4_;
}

Assistant:

PAL_ERROR
CorUnix::InternalResumeThread(
    CPalThread *pthrResumer,
    HANDLE hTargetThread,
    DWORD *pdwSuspendCount
    )
{
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pthrTarget = NULL;
    IPalObject *pobjThread = NULL;

    palError = InternalGetThreadDataFromHandle(
        pthrResumer,
        hTargetThread,
        0, // THREAD_SUSPEND_RESUME
        &pthrTarget,
        &pobjThread
        );

    if (NO_ERROR == palError)
    {
        palError = pthrResumer->suspensionInfo.InternalResumeThreadFromData(
            pthrResumer,
            pthrTarget,
            pdwSuspendCount
            );
    }

    if (NULL != pobjThread)
    {
        pobjThread->ReleaseReference(pthrResumer);
    }

    return palError;
}